

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O3

string * llama_format_tensor_shape_abi_cxx11_(string *__return_storage_ptr__,ggml_tensor *t)

{
  size_t sVar1;
  long lVar2;
  char buf [256];
  char acStack_128 [256];
  
  snprintf(acStack_128,0x100,"%5ld",t->ne[0]);
  lVar2 = 0;
  do {
    sVar1 = strlen(acStack_128);
    snprintf(acStack_128 + sVar1,0x100 - sVar1,", %5ld",t->ne[lVar2 + 1]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_128);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_128,acStack_128 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string llama_format_tensor_shape(const struct ggml_tensor * t) {
    char buf[256];
    snprintf(buf, sizeof(buf), "%5" PRId64, t->ne[0]);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        snprintf(buf + strlen(buf), sizeof(buf) - strlen(buf), ", %5" PRId64, t->ne[i]);
    }
    return buf;
}